

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecimalQuantity::shiftLeft(DecimalQuantity *this,int32_t numDigits)

{
  int8_t *piVar1;
  byte bVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  bVar2 = this->usingBytes;
  if (((bool)bVar2 == false) && (0x10 < this->precision + numDigits)) {
    switchStorage(this);
    bVar2 = this->usingBytes;
  }
  if ((bVar2 & 1) == 0) {
    (this->fBCD).bcdLong = (this->fBCD).bcdLong << ((char)numDigits * '\x04' & 0x3fU);
  }
  else {
    ensureCapacity(this,this->precision + numDigits);
    uVar3 = this->precision + numDigits;
    lVar4 = (long)(int)uVar3;
    lVar5 = (long)numDigits;
    if (lVar5 < lVar4) {
      uVar3 = numDigits;
    }
    for (; lVar5 < lVar4; lVar4 = lVar4 + -1) {
      piVar1 = (this->fBCD).bcdBytes.ptr;
      piVar1[lVar4 + -1] = piVar1[(lVar4 + -1) - lVar5];
    }
    while (uVar3 = uVar3 - 1, -1 < (int)uVar3) {
      (this->fBCD).bcdBytes.ptr[uVar3] = '\0';
    }
  }
  this->scale = this->scale - numDigits;
  this->precision = this->precision + numDigits;
  return;
}

Assistant:

void DecimalQuantity::shiftLeft(int32_t numDigits) {
    if (!usingBytes && precision + numDigits > 16) {
        switchStorage();
    }
    if (usingBytes) {
        ensureCapacity(precision + numDigits);
        int i = precision + numDigits - 1;
        for (; i >= numDigits; i--) {
            fBCD.bcdBytes.ptr[i] = fBCD.bcdBytes.ptr[i - numDigits];
        }
        for (; i >= 0; i--) {
            fBCD.bcdBytes.ptr[i] = 0;
        }
    } else {
        fBCD.bcdLong <<= (numDigits * 4);
    }
    scale -= numDigits;
    precision += numDigits;
}